

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O3

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  _Alloc_hider _Var12;
  bool bVar13;
  int iVar14;
  pointer pbVar15;
  int retVal;
  string command;
  string output_variable;
  string arguments;
  string return_variable;
  string coutput;
  string output;
  uint local_18c;
  cmCommand *local_188;
  undefined1 *local_180;
  long local_178;
  undefined1 local_170;
  undefined7 uStack_16f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  string local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  string local_118;
  string local_f8 [3];
  string local_90;
  string local_70;
  string local_50;
  
  pbVar15 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_188 = &this->super_cmCommand;
  local_160 = args;
  if (pbVar15 == pbVar2) {
    local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"called with incorrect number of arguments","");
    cmCommand::SetError(local_188,local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  local_138 = &local_128;
  bVar13 = false;
  local_130 = 0;
  local_128 = 0;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  iVar14 = 0;
  bVar5 = false;
  bVar11 = false;
  do {
    iVar6 = std::__cxx11::string::compare((char *)pbVar15);
    if (iVar6 == 0) {
      iVar14 = iVar14 + 1;
LAB_0023adfb:
      bVar5 = false;
LAB_0023ae03:
      bVar13 = false;
    }
    else if (bVar11) {
      if (local_158._M_string_length != 0) {
        local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,"called with incorrect number of arguments","");
        cmCommand::SetError(local_188,local_f8);
LAB_0023b28c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
          operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1
                         );
        }
        bVar5 = false;
        goto LAB_0023b2ab;
      }
      std::__cxx11::string::_M_assign((string *)&local_158);
      iVar14 = iVar14 + 1;
    }
    else {
      iVar7 = std::__cxx11::string::compare((char *)pbVar15);
      if (iVar7 != 0) {
        if (bVar13) {
          if (local_118._M_string_length != 0) {
            local_f8[0]._M_dataplus._M_p = (pointer)&local_f8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f8,"called with incorrect number of arguments","");
            cmCommand::SetError(local_188,local_f8);
            goto LAB_0023b28c;
          }
          std::__cxx11::string::_M_assign((string *)&local_118);
          iVar14 = iVar14 + 1;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)pbVar15);
          if (iVar7 != 0) {
            if (!bVar5) goto LAB_0023adfb;
            std::__cxx11::string::_M_append((char *)&local_138,(ulong)(pbVar15->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_138);
          }
          iVar14 = iVar14 + 1;
          bVar5 = true;
        }
        goto LAB_0023ae03;
      }
      iVar14 = iVar14 + 1;
      bVar13 = true;
      bVar5 = false;
    }
    pvVar3 = local_160;
    pbVar15 = pbVar15 + 1;
    bVar11 = iVar6 == 0;
  } while (pbVar15 != pbVar2);
  local_178 = 0;
  local_170 = 0;
  local_180 = &local_170;
  if (local_130 == 0) {
    std::__cxx11::string::_M_assign((string *)&local_180);
  }
  else {
    cmSystemTools::ConvertToRunCommandPath
              (local_f8,(local_160->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::operator=((string *)&local_180,(string *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_180);
    std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_138);
  }
  sVar4 = local_158._M_string_length;
  local_18c = 0;
  paVar1 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  pbVar15 = (pvVar3->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  if (((long)(pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5) - (long)iVar14 == 2)
  {
    cmsys::SystemTools::MakeDirectory(pbVar15 + 1,(mode_t *)0x0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_180,local_180 + local_178);
    bVar5 = RunCommand(&local_50,&local_90,(int *)&local_18c,
                       (pvVar3->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,sVar4 == 0,
                       Auto);
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    _Var12._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0023b0da;
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_180,local_180 + local_178);
    bVar5 = RunCommand(&local_70,&local_90,(int *)&local_18c,(char *)0x0,sVar4 == 0,Auto);
    _Var12._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0023b0da;
  }
  operator_delete(_Var12._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0023b0da:
  if (bVar5 == false) {
    local_18c = 0xffffffff;
  }
  if (local_158._M_string_length != 0) {
    uVar8 = std::__cxx11::string::find_first_not_of((char *)&local_90,0x54b730,0);
    lVar9 = std::__cxx11::string::find_last_not_of((char *)&local_90,0x54b730,0xffffffffffffffff);
    if (uVar8 == 0xffffffffffffffff) {
      uVar8 = 0;
    }
    lVar10 = local_90._M_string_length - 1;
    if (lVar9 != -1) {
      lVar10 = lVar9;
    }
    std::__cxx11::string::string((string *)local_f8,(string *)&local_90,uVar8,(lVar10 - uVar8) + 1);
    cmMakefile::AddDefinition(local_188->Makefile,&local_158,local_f8[0]._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
    }
  }
  if (local_118._M_string_length != 0) {
    sprintf((char *)local_f8,"%d",(ulong)local_18c);
    cmMakefile::AddDefinition(local_188->Makefile,&local_118,(char *)local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  bVar5 = true;
LAB_0023b2ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  return bVar5;
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command, output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command, output, retVal, nullptr,
                                              verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}